

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

Ref __thiscall
anon_unknown.dwarf_b296a::AssertionEmitter::emitAssertTrapFunc
          (AssertionEmitter *this,InvokeAction *invoke,Module *wasm,Name testFuncName,Name asmModule
          )

{
  pointer func;
  Ref RVar1;
  Ref *pRVar2;
  Value *pVVar3;
  Ref element;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  IString name;
  IString target;
  IString name_00;
  Name name_01;
  IString local_190;
  Value *local_180;
  Ref local_178;
  Value *local_170;
  Value *local_168;
  Value *local_160;
  Ref local_158;
  Ref local_150;
  Ref catchBlock;
  Ref tryBlock;
  Ref innerFunc;
  Type local_b8;
  Signature local_b0;
  HeapType local_a0;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_98;
  Expression *local_78;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *pvStack_70;
  Builder local_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_58;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> exprFunc;
  Expression *expr;
  Name innerFuncName;
  Module *wasm_local;
  InvokeAction *invoke_local;
  AssertionEmitter *this_local;
  Name testFuncName_local;
  Ref outerFunc;
  
  testFuncName_local.super_IString.str._M_len = testFuncName.super_IString.str._M_str;
  innerFuncName.super_IString.str._M_str = (char *)wasm;
  ::wasm::Name::Name((Name *)&expr,"f");
  exprFunc._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       translateInvoke(this,invoke,(Module *)innerFuncName.super_IString.str._M_str);
  ::wasm::Builder::Builder(&local_60,(Module *)innerFuncName.super_IString.str._M_str);
  local_78 = expr;
  pvStack_70 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
               innerFuncName.super_IString.str._M_len;
  local_98.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_98);
  ::wasm::Type::Type(&local_b8,none);
  ::wasm::Signature::Signature
            (&local_b0,local_b8,
             (Type)*(uintptr_t *)
                    ((long)exprFunc._M_t.
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8));
  ::wasm::HeapType::HeapType(&local_a0,local_b0);
  innerFunc.inst = (Value *)0x0;
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)&innerFunc);
  name_01.super_IString.str._M_str = (char *)local_78;
  name_01.super_IString.str._M_len = (size_t)&local_58;
  ::wasm::Builder::makeFunction
            (name_01,pvStack_70,(HeapType)&local_98,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_a0.id,
             (Expression *)&innerFunc);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector
            ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)&innerFunc);
  std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_98);
  func = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_58);
  RVar1 = processFunction(this,func);
  fixCalls(this,RVar1,asmModule);
  name.str._M_str = extraout_RDX;
  name.str._M_len = testFuncName_local.super_IString.str._M_len;
  testFuncName_local.super_IString.str._M_str =
       (char *)cashew::ValueBuilder::makeFunction(testFuncName.super_IString.str._M_len,name);
  pRVar2 = (Ref *)cashew::Ref::operator[]((int)&testFuncName_local + 8);
  pVVar3 = cashew::Ref::operator->(pRVar2);
  cashew::Value::push_back(pVVar3,RVar1);
  RVar1 = cashew::ValueBuilder::makeBlock();
  catchBlock.inst = (Value *)expr;
  target.str._M_str = extraout_RDX_00;
  target.str._M_len = innerFuncName.super_IString.str._M_len;
  element = cashew::ValueBuilder::makeCall((ValueBuilder *)expr,target);
  cashew::ValueBuilder::appendToBlock(RVar1,element);
  local_158 = cashew::ValueBuilder::makeBlock();
  local_150 = local_158;
  local_168 = (Value *)cashew::ValueBuilder::makeInt(1);
  local_160 = (Value *)cashew::ValueBuilder::makeReturn((Ref)local_168);
  cashew::ValueBuilder::appendToBlock(local_158,(Ref)local_160);
  pRVar2 = (Ref *)cashew::Ref::operator[]((int)&testFuncName_local + 8);
  pVVar3 = cashew::Ref::operator->(pRVar2);
  local_178 = RVar1;
  ::wasm::IString::IString(&local_190,"e");
  name_00.str._M_str = extraout_RDX_01;
  name_00.str._M_len = (size_t)local_190.str._M_str;
  local_180 = (Value *)cashew::ValueBuilder::makeName((ValueBuilder *)local_190.str._M_len,name_00);
  local_170 = (Value *)cashew::ValueBuilder::makeTry(local_178,(Ref)local_180,local_150);
  cashew::Value::push_back(pVVar3,(Ref)local_170);
  pRVar2 = (Ref *)cashew::Ref::operator[]((int)&testFuncName_local + 8);
  pVVar3 = cashew::Ref::operator->(pRVar2);
  RVar1 = cashew::ValueBuilder::makeInt(0);
  RVar1 = cashew::ValueBuilder::makeReturn(RVar1);
  cashew::Value::push_back(pVVar3,RVar1);
  emitFunction(this,(Ref)testFuncName_local.super_IString.str._M_str);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_58);
  return (Ref)(Value *)testFuncName_local.super_IString.str._M_str;
}

Assistant:

Ref AssertionEmitter::emitAssertTrapFunc(InvokeAction& invoke,
                                         Module& wasm,
                                         Name testFuncName,
                                         Name asmModule) {
  Name innerFuncName("f");
  Expression* expr = translateInvoke(invoke, wasm);
  std::unique_ptr<Function> exprFunc(
    Builder(wasm).makeFunction(innerFuncName,
                               std::vector<NameType>{},
                               Signature(Type::none, expr->type),
                               std::vector<NameType>{},
                               expr));
  Ref innerFunc = processFunction(exprFunc.get());
  fixCalls(innerFunc, asmModule);
  Ref outerFunc = ValueBuilder::makeFunction(testFuncName);
  outerFunc[3]->push_back(innerFunc);
  Ref tryBlock = ValueBuilder::makeBlock();
  ValueBuilder::appendToBlock(tryBlock, ValueBuilder::makeCall(innerFuncName));
  Ref catchBlock = ValueBuilder::makeBlock();
  ValueBuilder::appendToBlock(
    catchBlock, ValueBuilder::makeReturn(ValueBuilder::makeInt(1)));
  outerFunc[3]->push_back(ValueBuilder::makeTry(
    tryBlock, ValueBuilder::makeName((IString("e"))), catchBlock));
  outerFunc[3]->push_back(ValueBuilder::makeReturn(ValueBuilder::makeInt(0)));
  emitFunction(outerFunc);
  return outerFunc;
}